

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O0

vector<Range,_std::allocator<Range>_> * __thiscall
TextBuffer::Layer::find_all_in_range
          (vector<Range,_std::allocator<Range>_> *__return_storage_ptr__,Layer *this,Regex *regex,
          Range range,bool splay)

{
  Range range_00;
  anon_class_8_1_6971b95b local_50;
  Layer *local_48;
  Point PStack_40;
  undefined1 local_32;
  byte local_31;
  Regex *pRStack_30;
  bool splay_local;
  Regex *regex_local;
  Layer *this_local;
  Range range_local;
  vector<Range,_std::allocator<Range>_> *result;
  
  range_local.start = range.end;
  this_local = (Layer *)range.start;
  local_32 = 0;
  local_31 = splay;
  pRStack_30 = regex;
  regex_local = (Regex *)this;
  range_local.end = (Point)__return_storage_ptr__;
  std::vector<Range,_std::allocator<Range>_>::vector(__return_storage_ptr__);
  local_48 = this_local;
  PStack_40 = range_local.start;
  range_00.end = range_local.start;
  range_00.start = (Point)this_local;
  local_50.result = __return_storage_ptr__;
  scan_in_range<TextBuffer::Layer::find_all_in_range(Regex_const&,Range,bool)::_lambda(Range)_1_>
            (this,pRStack_30,range_00,&local_50,(bool)(local_31 & 1));
  return __return_storage_ptr__;
}

Assistant:

vector<Range> find_all_in_range(const Regex &regex, Range range, bool splay = false) {
    vector<Range> result;
    scan_in_range(regex, range, [&result](Range match_range) -> bool {
      result.push_back(match_range);
      return false;
    }, splay);
    return result;
  }